

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_action.cc
# Opt level: O3

void re2c::need(OutputFile *o,uint32_t ind,bool *readCh,size_t n,bool bSetMarker)

{
  pointer pcVar1;
  bool *pbVar2;
  opt_t *poVar3;
  OutputFile *pOVar4;
  size_t need;
  string local_88;
  uint32_t local_68;
  uint32_t local_64;
  string local_60;
  OutputFile *local_40;
  bool *local_38;
  
  poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  if (poVar3->target != DOT) {
    local_68 = last_fill_index;
    local_38 = readCh;
    poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    if (poVar3->fFlag == true) {
      last_fill_index = last_fill_index + 1;
      local_64 = local_68;
      pOVar4 = OutputFile::wind(o,ind);
      poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      pcVar1 = (poVar3->state_set)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar1,pcVar1 + (poVar3->state_set)._M_string_length);
      poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      replaceParam<unsigned_int>(&local_88,&local_60,&poVar3->state_set_arg,&local_64);
      OutputFile::wstring(pOVar4,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      if (poVar3->state_set_naked == false) {
        pOVar4 = OutputFile::ws(o,"(");
        pOVar4 = OutputFile::wu32(pOVar4,local_64);
        OutputFile::ws(pOVar4,");");
      }
      OutputFile::ws(o,"\n");
    }
    poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    if ((n != 0) && (poVar3->fill_use != false)) {
      OutputFile::wind(o,ind);
      poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      if (n == 1) {
        need = 1;
        if (poVar3->fill_check != false) {
          local_40 = OutputFile::ws(o,"if (");
          poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
          InputAPI::expr_lessthan_one_abi_cxx11_(&local_88,&poVar3->input_api);
          pOVar4 = OutputFile::wstring(local_40,&local_88);
          OutputFile::ws(pOVar4,") ");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        need = n;
        if (poVar3->fill_check != false) {
          pOVar4 = OutputFile::ws(o,"if (");
          poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
          InputAPI::expr_lessthan_abi_cxx11_(&local_88,&poVar3->input_api,n);
          pOVar4 = OutputFile::wstring(pOVar4,&local_88);
          OutputFile::ws(pOVar4,") ");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
      }
      genYYFill(o,need);
    }
    poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    pbVar2 = local_38;
    if (poVar3->fFlag == true) {
      poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      pOVar4 = OutputFile::wstring(o,&poVar3->yyfilllabel);
      pOVar4 = OutputFile::wu32(pOVar4,local_68);
      OutputFile::ws(pOVar4,":\n");
    }
    if (n != 0) {
      if (bSetMarker) {
        poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
        InputAPI::stmt_backup_peek_abi_cxx11_(&local_88,&poVar3->input_api,ind);
        OutputFile::wstring(o,&local_88);
      }
      else {
        poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
        InputAPI::stmt_peek_abi_cxx11_(&local_88,&poVar3->input_api,ind);
        OutputFile::wstring(o,&local_88);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      *pbVar2 = false;
    }
  }
  return;
}

Assistant:

void need (OutputFile & o, uint32_t ind, bool & readCh, size_t n, bool bSetMarker)
{
	if (opts->target == opt_t::DOT)
	{
		return;
	}

	uint32_t fillIndex = last_fill_index;

	if (opts->fFlag)
	{
		last_fill_index++;
		genSetState (o, ind, fillIndex);
	}

	if (opts->fill_use && n > 0)
	{
		o.wind(ind);
		if (n == 1)
		{
			if (opts->fill_check)
			{
				o.ws("if (").wstring(opts->input_api.expr_lessthan_one ()).ws(") ");
			}
			genYYFill(o, n);
		}
		else
		{
			if (opts->fill_check)
			{
				o.ws("if (").wstring(opts->input_api.expr_lessthan (n)).ws(") ");
			}
			genYYFill(o, n);
		}
	}

	if (opts->fFlag)
	{
		o.wstring(opts->yyfilllabel).wu32(fillIndex).ws(":\n");
	}

	if (n > 0)
	{
		if (bSetMarker)
		{
			o.wstring(opts->input_api.stmt_backup_peek (ind));
		}
		else
		{
			o.wstring(opts->input_api.stmt_peek (ind));
		}
		readCh = false;
	}
}